

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objcomp.c
# Opt level: O1

uint objemt(mcmcxdef *ctx,objnum objn,prpnum prop,dattyp typ)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  errcxdef *peVar4;
  mcmodef **ppmVar5;
  uint16_t tmp;
  uchar *puVar6;
  uint uVar7;
  prpnum *ppVar8;
  ushort newsiz;
  errdef fr_;
  ushort local_16a;
  errdef local_168;
  
  puVar6 = mcmlck(ctx,objn);
  local_168.errcode = _setjmp((__jmp_buf_tag *)local_168.errbuf);
  if (local_168.errcode == 0) {
    peVar4 = ctx->mcmcxgl->mcmcxerr;
    local_168.errprv = peVar4->errcxptr;
    peVar4->errcxptr = &local_168;
    objdelp(ctx,objn,prop,0);
    uVar2 = *(ushort *)(puVar6 + 8);
    ppmVar5 = ctx->mcmcxgl->mcmcxtab;
    uVar7 = objn & 0xff;
    uVar3 = ctx->mcmcxmtb[objn >> 8][uVar7];
    if (uVar2 + 6 <
        (uint)*(ushort *)((long)&ppmVar5[uVar3 >> 8]->mcmosiz + (ulong)((uVar3 & 0xff) << 5))) {
      ppVar8 = (prpnum *)(puVar6 + (uint)uVar2);
    }
    else {
      uVar3 = ctx->mcmcxmtb[objn >> 8][uVar7];
      local_16a = (uVar2 - *(short *)((long)&ppmVar5[uVar3 >> 8]->mcmosiz +
                                     (ulong)((uVar3 & 0xff) << 5))) + 0x46;
      puVar6 = objexp(ctx,objn,&local_16a);
      ppVar8 = (prpnum *)(puVar6 + *(ushort *)(puVar6 + 8));
    }
    *ppVar8 = prop;
    *(uchar *)(ppVar8 + 1) = (uchar)typ;
    *(uchar *)((long)ppVar8 + 5) = '\0';
    *(short *)(puVar6 + 6) = *(short *)(puVar6 + 6) + 1;
    ctx->mcmcxgl->mcmcxerr->errcxptr = local_168.errprv;
    puVar1 = (ushort *)
             ((long)&ctx->mcmcxgl->mcmcxtab[ctx->mcmcxmtb[objn >> 8][uVar7] >> 8]->mcmoflg +
             (ulong)((ctx->mcmcxmtb[objn >> 8][uVar7] & 0xff) << 5));
    *puVar1 = *puVar1 | 1;
    mcmunlck(ctx,objn);
    return ((int)ppVar8 - (int)puVar6) + 6;
  }
  ctx->mcmcxgl->mcmcxerr->errcxptr = local_168.errprv;
  mcmunlck(ctx,objn);
  errrse1(ctx->mcmcxgl->mcmcxerr,&local_168);
}

Assistant:

uint objemt(mcmcxdef *ctx, objnum objn, prpnum prop, dattyp typ)
{
    objdef *objptr;
    prpdef *p;
    
    objptr = (objdef *)mcmlck(ctx, (mcmon)objn);
    
    ERRBEGIN(ctx->mcmcxgl->mcmcxerr)

    objdelp(ctx, objn, prop, FALSE);   /* delete old property value, if any */
    p = objpfre(objptr);                        /* get top of property area */
    
    if ((char *)p - (char *)objptr + PRPHDRSIZ >=
        mcmobjsiz(ctx, (mcmon)objn))
    {
        ushort newsiz = 64 + ((objfree(objptr) + PRPHDRSIZ) -
                              mcmobjsiz(ctx, (mcmon)objn));
        objptr = objexp(ctx, objn, &newsiz);
        p = objpfre(objptr);                       /* object may have moved */
    }
    
    /* set up property header as much as we can (don't know size yet) */
    prpsetprop(p, prop);
    prptype(p) = typ;
    prpflg(p) = 0;
    objsnp(objptr, objnprop(objptr) + 1);              /* one more property */

    ERRCLEAN(ctx->mcmcxgl->mcmcxerr)
        mcmunlck(ctx, (mcmon)objn);
    ERRENDCLN(ctx->mcmcxgl->mcmcxerr)

    /* dirty the cache object and release the lock before return */
    mcmtch(ctx, objn);
    mcmunlck(ctx, (mcmon)objn);
    return(((uchar *)prpvalp(p)) - ((uchar *)objptr));
}